

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O3

Result __thiscall
wabt::BinaryReaderLogging::OnImportTable
          (BinaryReaderLogging *this,Index import_index,string_view module_name,
          string_view field_name,Index table_index,Type elem_type,Limits *elem_limits)

{
  Stream *this_00;
  Enum EVar1;
  char *pcVar2;
  char buf [100];
  
  anon_unknown_23::SPrintLimits(buf,(size_t)elem_limits,(Limits *)module_name.data_);
  WriteIndent(this);
  this_00 = this->stream_;
  pcVar2 = Type::GetName(&elem_type);
  Stream::Writef(this_00,"OnImportTable(import_index: %u, table_index: %u, elem_type: %s, %s)\n",
                 import_index,(ulong)table_index,pcVar2,buf);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x13])
                    (this->reader_,import_index,(Limits *)module_name.data_,module_name.size_,
                     field_name.data_,field_name.size_,(ulong)table_index,
                     (ulong)(uint)elem_type.enum_,elem_limits);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImportTable(Index import_index,
                                          string_view module_name,
                                          string_view field_name,
                                          Index table_index,
                                          Type elem_type,
                                          const Limits* elem_limits) {
  char buf[100];
  SPrintLimits(buf, sizeof(buf), elem_limits);
  LOGF("OnImportTable(import_index: %" PRIindex ", table_index: %" PRIindex
       ", elem_type: %s, %s)\n",
       import_index, table_index, elem_type.GetName(), buf);
  return reader_->OnImportTable(import_index, module_name, field_name,
                                table_index, elem_type, elem_limits);
}